

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coverage.cpp
# Opt level: O0

void __thiscall Coverage_variablePair_Test::TestBody(Coverage_variablePair_Test *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  byte bVar2;
  bool bVar3;
  char *pcVar4;
  AssertionResult local_180 [2];
  AssertHelper local_160 [8];
  Message local_158 [15];
  bool local_149;
  undefined1 local_148 [8];
  AssertionResult gtest_ar__2;
  AssertHelper local_118 [8];
  Message local_110 [15];
  bool local_101;
  undefined1 local_100 [8];
  AssertionResult gtest_ar__1;
  AssertHelper local_d0 [8];
  Message local_c8 [15];
  bool local_b9;
  undefined1 local_b8 [8];
  AssertionResult gtest_ar_;
  VariablePairPtr variablePair3;
  undefined1 local_88 [8];
  VariablePairPtr variablePair2;
  undefined1 local_68 [8];
  VariablePairPtr variablePair1;
  allocator<char> local_41;
  string local_40 [32];
  undefined1 local_20 [8];
  VariablePtr v;
  Coverage_variablePair_Test *this_local;
  
  v.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_40,"var",&local_41);
  libcellml::Variable::create((string *)local_20);
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator(&local_41);
  p_Var1 = &variablePair2.super___shared_ptr<libcellml::VariablePair,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount;
  std::shared_ptr<libcellml::Variable>::shared_ptr
            ((shared_ptr<libcellml::Variable> *)p_Var1,(nullptr_t)0x0);
  libcellml::VariablePair::create((shared_ptr *)local_68,(shared_ptr *)p_Var1);
  std::shared_ptr<libcellml::Variable>::~shared_ptr((shared_ptr<libcellml::Variable> *)p_Var1);
  p_Var1 = &variablePair3.super___shared_ptr<libcellml::VariablePair,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount;
  std::shared_ptr<libcellml::Variable>::shared_ptr
            ((shared_ptr<libcellml::Variable> *)p_Var1,(nullptr_t)0x0);
  libcellml::VariablePair::create((shared_ptr *)local_88,(shared_ptr *)local_20);
  std::shared_ptr<libcellml::Variable>::~shared_ptr((shared_ptr<libcellml::Variable> *)p_Var1);
  libcellml::VariablePair::create((shared_ptr *)&gtest_ar_.message_,(shared_ptr *)local_20);
  std::__shared_ptr_access<libcellml::VariablePair,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::VariablePair,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)local_68);
  bVar2 = libcellml::VariablePair::isValid();
  local_b9 = (bool)(~bVar2 & 1);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_b8,&local_b9,(type *)0x0)
  ;
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b8);
  if (!bVar3) {
    testing::Message::Message(local_c8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&gtest_ar__1.message_,local_b8,"variablePair1->isValid()","true");
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (local_d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/coverage/coverage.cpp"
               ,0xbb,pcVar4);
    testing::internal::AssertHelper::operator=(local_d0,local_c8);
    testing::internal::AssertHelper::~AssertHelper(local_d0);
    std::__cxx11::string::~string((string *)&gtest_ar__1.message_);
    testing::Message::~Message(local_c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b8);
  std::__shared_ptr_access<libcellml::VariablePair,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::VariablePair,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)local_88);
  bVar2 = libcellml::VariablePair::isValid();
  local_101 = (bool)(~bVar2 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_100,&local_101,(type *)0x0);
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_100);
  if (!bVar3) {
    testing::Message::Message(local_110);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&gtest_ar__2.message_,local_100,"variablePair2->isValid()","true")
    ;
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (local_118,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/coverage/coverage.cpp"
               ,0xbc,pcVar4);
    testing::internal::AssertHelper::operator=(local_118,local_110);
    testing::internal::AssertHelper::~AssertHelper(local_118);
    std::__cxx11::string::~string((string *)&gtest_ar__2.message_);
    testing::Message::~Message(local_110);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_100);
  std::__shared_ptr_access<libcellml::VariablePair,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::VariablePair,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)&gtest_ar_.message_);
  bVar2 = libcellml::VariablePair::isValid();
  local_149 = (bool)(bVar2 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_148,&local_149,(type *)0x0);
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_148);
  if (!bVar3) {
    testing::Message::Message(local_158);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (local_180,local_148,"variablePair3->isValid()","false");
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (local_160,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/coverage/coverage.cpp"
               ,0xbd,pcVar4);
    testing::internal::AssertHelper::operator=(local_160,local_158);
    testing::internal::AssertHelper::~AssertHelper(local_160);
    std::__cxx11::string::~string((string *)local_180);
    testing::Message::~Message(local_158);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_148);
  std::shared_ptr<libcellml::VariablePair>::~shared_ptr
            ((shared_ptr<libcellml::VariablePair> *)&gtest_ar_.message_);
  std::shared_ptr<libcellml::VariablePair>::~shared_ptr
            ((shared_ptr<libcellml::VariablePair> *)local_88);
  std::shared_ptr<libcellml::VariablePair>::~shared_ptr
            ((shared_ptr<libcellml::VariablePair> *)local_68);
  std::shared_ptr<libcellml::Variable>::~shared_ptr((shared_ptr<libcellml::Variable> *)local_20);
  return;
}

Assistant:

TEST(Coverage, variablePair)
{
    auto v = libcellml::Variable::create("var");
    auto variablePair1 = libcellml::VariablePair::create(nullptr, v);
    auto variablePair2 = libcellml::VariablePair::create(v, nullptr);
    auto variablePair3 = libcellml::VariablePair::create(v, v);

    EXPECT_FALSE(variablePair1->isValid());
    EXPECT_FALSE(variablePair2->isValid());
    EXPECT_TRUE(variablePair3->isValid());
}